

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O3

bool __thiscall
tinyusdz::
Animatable<std::vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>_>::get
          (Animatable<std::vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>_>
           *this,double t,
          vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> *v,
          TimeSampleInterpolationType tinerp)

{
  bool bVar1;
  
  if ((v == (vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> *)0x0) ||
     (this->_blocked != false)) {
LAB_00553091:
    bVar1 = false;
  }
  else {
    if ((!NAN(t)) || (this->_has_value != true)) {
      if ((this->_ts)._dirty == true) {
        TypedTimeSamples<std::vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>_>
        ::update(&this->_ts);
      }
      if ((this->_ts)._samples.
          super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>_>::Sample>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this->_ts)._samples.
          super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>_>::Sample>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        bVar1 = TypedTimeSamples<std::vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>_>
                ::
                get<std::vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>,_nullptr>
                          (&this->_ts,v,t,tinerp);
        return bVar1;
      }
      if ((this->_has_value != true) || (this->_blocked != false)) goto LAB_00553091;
    }
    ::std::vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>::operator=
              (v,&this->_value);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool get(double t, T *v,
           const value::TimeSampleInterpolationType tinerp =
               value::TimeSampleInterpolationType::Linear) const {
    if (!v) {
      return false;
    }

    if (is_blocked()) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {
      if (has_value()) {
        (*v) = _value;
        return true;
      }
    }

    if (has_timesamples()) {
      return _ts.get(v, t, tinerp);
    }
    
    if (has_default()) {
      return get_scalar(v);
    }

    return false;
  }